

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O3

void __thiscall
cnn::PickElement::backward_impl
          (PickElement *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx,Tensor *dEdf,uint i,Tensor *dEdxi)

{
  float fVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar5;
  pointer puVar6;
  float *pfVar7;
  float *pfVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  int iVar14;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_48;
  
  if (i != 0) {
    __assert_fail("i == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/clab[P]att-coref/cnn/cnn/nodes.cc"
                  ,0x618,
                  "virtual void cnn::PickElement::backward_impl(const vector<const Tensor *> &, const Tensor &, const Tensor &, unsigned int, Tensor &) const"
                 );
  }
  if (this->pval == (uint *)0x0) {
    pvVar5 = this->pvals;
    if (pvVar5 == (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      __assert_fail("pvals",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/clab[P]att-coref/cnn/cnn/nodes.cc"
                    ,0x61f,
                    "virtual void cnn::PickElement::backward_impl(const vector<const Tensor *> &, const Tensor &, const Tensor &, unsigned int, Tensor &) const"
                   );
    }
    puVar6 = (pvVar5->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar12 = (long)(pvVar5->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                   .super__Vector_impl_data._M_finish - (long)puVar6;
    if (lVar12 != 0) {
      pfVar7 = dEdf->v;
      pfVar8 = dEdxi->v;
      uVar2 = (dEdxi->d).bd;
      uVar3 = (dEdxi->d).d[0];
      uVar4 = (dEdxi->d).nd;
      uVar9 = 0;
      do {
        iVar14 = 1;
        if ((ulong)uVar4 != 0) {
          uVar10 = 0;
          do {
            iVar14 = iVar14 * (dEdxi->d).d[uVar10];
            uVar10 = uVar10 + 1;
          } while (uVar4 != uVar10);
        }
        uVar10 = (ulong)(dEdxi->d).d[1];
        if (uVar4 < 2) {
          uVar10 = 1;
        }
        uVar10 = uVar10 * uVar3;
        uVar13 = (ulong)puVar6[uVar9];
        if (uVar10 < uVar13 || uVar10 - uVar13 == 0) goto LAB_001a864f;
        uVar11 = (int)(uVar9 % (ulong)uVar2) * iVar14;
        pfVar8[uVar11 + uVar13] = pfVar7[uVar9] + pfVar8[uVar11 + uVar13];
        uVar9 = (ulong)((int)uVar9 + 1);
      } while (uVar9 < (ulong)(lVar12 >> 2));
    }
  }
  else {
    fVar1 = *dEdf->v;
    Tensor::operator*(&local_48,dEdxi);
    uVar9 = (ulong)*this->pval;
    if (local_48.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_cols.m_value *
        local_48.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_rows.m_value - uVar9 == 0 ||
        local_48.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_cols.m_value *
        local_48.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_rows.m_value < (long)uVar9) {
LAB_001a864f:
      __assert_fail("index >= 0 && index < size()",
                    "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                    "Scalar &Eigen::DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float, -1, -1>>, 1>::operator()(Index) [Derived = Eigen::Map<Eigen::Matrix<float, -1, -1>>, Level = 1]"
                   );
    }
    local_48.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>.
    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>.
    m_data[uVar9] =
         fVar1 + local_48.
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                 .
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                 .m_data[uVar9];
  }
  return;
}

Assistant:

void PickElement::backward_impl(const vector<const Tensor*>& xs,
                    const Tensor& fx,
                    const Tensor& dEdf,
                    unsigned i,
                    Tensor& dEdxi) const {
  assert(i == 0);
#ifdef HAVE_CUDA
  throw std::runtime_error("PickElement not yet implemented for CUDA");
#else
  if(pval) {
    (*dEdxi)(*pval) += dEdf.v[0];
  } else {
    assert(pvals);
    for(unsigned b = 0; b < pvals->size(); ++b)
      dEdxi.batch_matrix(b)((*pvals)[b]) += dEdf.v[b];
  }
#endif
}